

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmPTest<(moira::Instr)185,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  u32 ext;
  StrWriter *this_00;
  char *str_00;
  Moira *this_01;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  this_01 = this;
  ext = dasmIncRead<2>(this,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    bVar2 = isValidExtMMU(this_01,PTEST,AL,op,ext);
    if (!bVar2) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)185,(moira::Mode)8,4>(this,str,addr,op);
      return;
    }
  }
  this_00 = StrWriter::operator<<(str);
  str_00 = "r";
  if ((ext >> 9 & 1) == 0) {
    str_00 = "w";
  }
  StrWriter::operator<<(this_00,str_00);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(str,(Fc)(ext & 0x1f));
  StrWriter::operator<<(str);
  Op<(moira::Mode)8,2>((Ea<(moira::Mode)8,_2> *)local_44,this,op & 7,addr);
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)local_44);
  StrWriter::operator<<(str);
  StrWriter::operator<<(str,ext >> 10 & 7);
  if ((ext >> 8 & 1) != 0) {
    StrWriter::operator<<(str);
    StrWriter::operator<<(str,(An)(ext >> 5 & 7));
  }
  return;
}

Assistant:

void
Moira::dasmPTest(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto reg = _____________xxx (op);
    auto lev = ___xxx__________ (ext);
    auto rw  = ______x_________ (ext);
    auto a   = _______x________ (ext);
    auto an  = ________xxx_____ (ext);
    auto fc  = ___________xxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << (rw ? "r" : "w") << str.tab;
    str << Fc{fc} << Sep{} << Op<M>(reg, addr) << Sep{} << lev;
    if (a) { str << Sep{} << An{an}; }
}